

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int valueFromExpr(sqlite3 *db,Expr *pExpr,u8 enc,u8 affinity,sqlite3_value **ppVal,
                 ValueNewStat4Ctx *pCtx)

{
  byte bVar1;
  u8 uVar2;
  int iVar3;
  int iVar4;
  sqlite3_value *pRec;
  MemValue MVar5;
  sqlite3_value **xDel;
  char *pcVar6;
  long lStack_50;
  sqlite3_value *local_38;
  
  local_38 = (Mem *)0x0;
  for (; (bVar1 = pExpr->op, bVar1 == 0xae || (bVar1 == 0xb5)); pExpr = pExpr->pLeft) {
  }
  if (bVar1 == 0xb0) {
    bVar1 = pExpr->op2;
  }
  if (bVar1 == 0xad) {
    pExpr = pExpr->pLeft;
    bVar1 = pExpr->op;
    if ((bVar1 | 2) != 0x9b) {
      iVar3 = valueFromExpr(db,pExpr,enc,affinity,&local_38,pCtx);
      pRec = local_38;
      iVar4 = 0;
      if (local_38 != (Mem *)0x0 && iVar3 == 0) {
        sqlite3VdbeMemNumerify(local_38);
        if ((pRec->flags & 8) == 0) {
          (pRec->u).i = -(pRec->u).i;
        }
        else {
          (pRec->u).i = (pRec->u).i ^ 0x8000000000000000;
        }
        applyAffinity(pRec,affinity,enc);
      }
      goto LAB_001483ec;
    }
    pcVar6 = "-";
    lStack_50 = -1;
  }
  else {
    if (bVar1 == 0x24) {
      uVar2 = sqlite3AffinityType((pExpr->u).zToken,(Column *)0x0);
      iVar3 = valueFromExpr(db,pExpr->pLeft,enc,uVar2,ppVal,pCtx);
      if (*ppVal == (Mem *)0x0) {
        return iVar3;
      }
      sqlite3VdbeMemCast(*ppVal,uVar2,enc);
      applyAffinity(*ppVal,affinity,enc);
      return iVar3;
    }
    pcVar6 = "";
    lStack_50 = 1;
  }
  if (bVar1 == 0x75) {
LAB_001481a1:
    xDel = ppVal;
    pRec = sqlite3ValueNew(db);
    if (pRec != (sqlite3_value *)0x0) {
      if ((pExpr->flags & 0x800) == 0) {
        pcVar6 = sqlite3MPrintf(db,"%s%s",pcVar6,(pExpr->u).zToken);
        if (pcVar6 == (char *)0x0) goto LAB_00148336;
        sqlite3ValueSetStr(pRec,(int)pcVar6,(void *)0x1,0xe0,(_func_void_void_ptr *)xDel);
      }
      else {
        sqlite3VdbeMemSetInt64(pRec,lStack_50 * (pExpr->u).iValue);
      }
      uVar2 = 'C';
      if (affinity != 'A' || (bVar1 & 0xfd) != 0x99) {
        uVar2 = affinity;
      }
      applyAffinity(pRec,uVar2,'\x01');
      if ((pRec->flags & 0x2c) != 0) {
        pRec->flags = pRec->flags & 0xfffd;
      }
      iVar4 = 0;
      if (enc != '\x01') {
        iVar4 = sqlite3VdbeChangeEncoding(pRec,(uint)enc);
      }
LAB_001483ec:
      *ppVal = pRec;
      return iVar4;
    }
  }
  else {
    if (bVar1 != 0x79) {
      if (bVar1 != 0x99) {
        if (bVar1 == 0x9a) {
          pRec = sqlite3ValueNew(db);
          iVar4 = 0;
          if (pRec != (sqlite3_value *)0x0) {
            pcVar6 = (pExpr->u).zToken;
            iVar3 = sqlite3Strlen30(pcVar6 + 2);
            pcVar6 = (char *)sqlite3HexToBlob(db,pcVar6 + 2,iVar3 + -1);
            sqlite3VdbeMemSetStr
                      (pRec,pcVar6,(long)(iVar3 + -1) / 2 & 0xffffffff,'\0',sqlite3OomClear);
            goto LAB_001483ec;
          }
          goto LAB_00148333;
        }
        if (bVar1 == 0xaa) {
          pRec = sqlite3ValueNew(db);
          iVar4 = 0;
          if (pRec == (sqlite3_value *)0x0) {
            pRec = (sqlite3_value *)0x0;
          }
          else {
            pRec->flags = 4;
            MVar5.i._1_7_ = 0;
            MVar5.i._0_1_ = (pExpr->u).zToken[4] == '\0';
            pRec->u = MVar5;
          }
          goto LAB_001483ec;
        }
        if (bVar1 != 0x9b) {
          pRec = (sqlite3_value *)0x0;
          iVar4 = 0;
          goto LAB_001483ec;
        }
      }
      goto LAB_001481a1;
    }
    pRec = sqlite3ValueNew(db);
    iVar4 = 0;
    if (pRec != (sqlite3_value *)0x0) {
      sqlite3VdbeMemSetNull(pRec);
      goto LAB_001483ec;
    }
  }
LAB_00148333:
  pRec = (sqlite3_value *)0x0;
LAB_00148336:
  sqlite3OomFault(db);
  sqlite3DbFree(db,(void *)0x0);
  sqlite3ValueFree(pRec);
  return 7;
}

Assistant:

static int valueFromExpr(
  sqlite3 *db,                    /* The database connection */
  const Expr *pExpr,              /* The expression to evaluate */
  u8 enc,                         /* Encoding to use */
  u8 affinity,                    /* Affinity to use */
  sqlite3_value **ppVal,          /* Write the new value here */
  struct ValueNewStat4Ctx *pCtx   /* Second argument for valueNew() */
){
  int op;
  char *zVal = 0;
  sqlite3_value *pVal = 0;
  int negInt = 1;
  const char *zNeg = "";
  int rc = SQLITE_OK;

  assert( pExpr!=0 );
  while( (op = pExpr->op)==TK_UPLUS || op==TK_SPAN ) pExpr = pExpr->pLeft;
  if( op==TK_REGISTER ) op = pExpr->op2;

  /* Compressed expressions only appear when parsing the DEFAULT clause
  ** on a table column definition, and hence only when pCtx==0.  This
  ** check ensures that an EP_TokenOnly expression is never passed down
  ** into valueFromFunction(). */
  assert( (pExpr->flags & EP_TokenOnly)==0 || pCtx==0 );

  if( op==TK_CAST ){
    u8 aff;
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    aff = sqlite3AffinityType(pExpr->u.zToken,0);
    rc = valueFromExpr(db, pExpr->pLeft, enc, aff, ppVal, pCtx);
    testcase( rc!=SQLITE_OK );
    if( *ppVal ){
      sqlite3VdbeMemCast(*ppVal, aff, enc);
      sqlite3ValueApplyAffinity(*ppVal, affinity, enc);
    }
    return rc;
  }

  /* Handle negative integers in a single step.  This is needed in the
  ** case when the value is -9223372036854775808.
  */
  if( op==TK_UMINUS
   && (pExpr->pLeft->op==TK_INTEGER || pExpr->pLeft->op==TK_FLOAT) ){
    pExpr = pExpr->pLeft;
    op = pExpr->op;
    negInt = -1;
    zNeg = "-";
  }

  if( op==TK_STRING || op==TK_FLOAT || op==TK_INTEGER ){
    pVal = valueNew(db, pCtx);
    if( pVal==0 ) goto no_mem;
    if( ExprHasProperty(pExpr, EP_IntValue) ){
      sqlite3VdbeMemSetInt64(pVal, (i64)pExpr->u.iValue*negInt);
    }else{
      zVal = sqlite3MPrintf(db, "%s%s", zNeg, pExpr->u.zToken);
      if( zVal==0 ) goto no_mem;
      sqlite3ValueSetStr(pVal, -1, zVal, SQLITE_UTF8, SQLITE_DYNAMIC);
    }
    if( (op==TK_INTEGER || op==TK_FLOAT ) && affinity==SQLITE_AFF_BLOB ){
      sqlite3ValueApplyAffinity(pVal, SQLITE_AFF_NUMERIC, SQLITE_UTF8);
    }else{
      sqlite3ValueApplyAffinity(pVal, affinity, SQLITE_UTF8);
    }
    assert( (pVal->flags & MEM_IntReal)==0 );
    if( pVal->flags & (MEM_Int|MEM_IntReal|MEM_Real) ){
      testcase( pVal->flags & MEM_Int );
      testcase( pVal->flags & MEM_Real );
      pVal->flags &= ~MEM_Str;
    }
    if( enc!=SQLITE_UTF8 ){
      rc = sqlite3VdbeChangeEncoding(pVal, enc);
    }
  }else if( op==TK_UMINUS ) {
    /* This branch happens for multiple negative signs.  Ex: -(-5) */
    if( SQLITE_OK==valueFromExpr(db,pExpr->pLeft,enc,affinity,&pVal,pCtx)
     && pVal!=0
    ){
      sqlite3VdbeMemNumerify(pVal);
      if( pVal->flags & MEM_Real ){
        pVal->u.r = -pVal->u.r;
      }else if( pVal->u.i==SMALLEST_INT64 ){
#ifndef SQLITE_OMIT_FLOATING_POINT
        pVal->u.r = -(double)SMALLEST_INT64;
#else
        pVal->u.r = LARGEST_INT64;
#endif
        MemSetTypeFlag(pVal, MEM_Real);
      }else{
        pVal->u.i = -pVal->u.i;
      }
      sqlite3ValueApplyAffinity(pVal, affinity, enc);
    }
  }else if( op==TK_NULL ){
    pVal = valueNew(db, pCtx);
    if( pVal==0 ) goto no_mem;
    sqlite3VdbeMemSetNull(pVal);
  }
#ifndef SQLITE_OMIT_BLOB_LITERAL
  else if( op==TK_BLOB ){
    int nVal;
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    assert( pExpr->u.zToken[0]=='x' || pExpr->u.zToken[0]=='X' );
    assert( pExpr->u.zToken[1]=='\'' );
    pVal = valueNew(db, pCtx);
    if( !pVal ) goto no_mem;
    zVal = &pExpr->u.zToken[2];
    nVal = sqlite3Strlen30(zVal)-1;
    assert( zVal[nVal]=='\'' );
    sqlite3VdbeMemSetStr(pVal, sqlite3HexToBlob(db, zVal, nVal), nVal/2,
                         0, SQLITE_DYNAMIC);
  }
#endif
#ifdef SQLITE_ENABLE_STAT4
  else if( op==TK_FUNCTION && pCtx!=0 ){
    rc = valueFromFunction(db, pExpr, enc, affinity, &pVal, pCtx);
  }
#endif
  else if( op==TK_TRUEFALSE ){
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    pVal = valueNew(db, pCtx);
    if( pVal ){
      pVal->flags = MEM_Int;
      pVal->u.i = pExpr->u.zToken[4]==0;
    }
  }

  *ppVal = pVal;
  return rc;

no_mem:
#ifdef SQLITE_ENABLE_STAT4
  if( pCtx==0 || NEVER(pCtx->pParse->nErr==0) )
#endif
    sqlite3OomFault(db);
  sqlite3DbFree(db, zVal);
  assert( *ppVal==0 );
#ifdef SQLITE_ENABLE_STAT4
  if( pCtx==0 ) sqlite3ValueFree(pVal);
#else
  assert( pCtx==0 ); sqlite3ValueFree(pVal);
#endif
  return SQLITE_NOMEM_BKPT;
}